

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::BasicBuildMonolithic::Run(BasicBuildMonolithic *this)

{
  bool bVar1;
  int iVar2;
  float *pfVar3;
  Vector<float,_4> local_94;
  Vector<float,_4> local_84;
  undefined1 local_74 [8];
  vec4 data;
  GLuint local_54;
  byte local_4d;
  GLuint buffer;
  GLuint GStack_48;
  bool res;
  GLuint p;
  GLuint sh3;
  GLuint sh2;
  GLint type;
  GLuint sh1;
  char *cs3;
  char *cs2;
  char *cs1 [2];
  BasicBuildMonolithic *this_local;
  
  cs2 = "#version 430 core";
  cs1[0] = "\nlayout(local_size_x = 1) in;\nvoid Run();\nvoid main() {\n  Run();\n}";
  cs3 = 
  "#version 430 core\nlayout(binding = 0, std430) buffer Output {\n  vec4 g_output;\n};\nvec4 CalculateOutput();\nvoid Run() {\n  g_output = CalculateOutput();\n}"
  ;
  _type = 
  "#version 430 core\nlayout(local_size_x = 1) in;\nlayout(binding = 0, std430) buffer Output {\n  vec4 g_output;\n};\nvec4 CalculateOutput() {\n  g_output = vec4(0);\n  return vec4(1, 2, 3, 4);\n}"
  ;
  cs1[1] = (char *)this;
  sh2 = glu::CallLogWrapper::glCreateShader
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x91b9);
  glu::CallLogWrapper::glGetShaderiv
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,sh2,0x8b4f,(GLint *)&sh3);
  if (sh3 == 0x91b9) {
    glu::CallLogWrapper::glShaderSource
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,sh2,2,&cs2,(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,sh2);
    p = glu::CallLogWrapper::glCreateShader
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x91b9);
    glu::CallLogWrapper::glShaderSource
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,p,1,&cs3,(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,p);
    GStack_48 = glu::CallLogWrapper::glCreateShader
                          (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                            super_CallLogWrapper,0x91b9);
    glu::CallLogWrapper::glShaderSource
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,GStack_48,1,(GLchar **)&type,(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,GStack_48);
    buffer = glu::CallLogWrapper::glCreateProgram
                       (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                         super_CallLogWrapper);
    glu::CallLogWrapper::glAttachShader
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,buffer,sh2);
    glu::CallLogWrapper::glAttachShader
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,buffer,p);
    glu::CallLogWrapper::glAttachShader
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,buffer,GStack_48);
    glu::CallLogWrapper::glLinkProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,buffer);
    glu::CallLogWrapper::glDeleteShader
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,sh2);
    glu::CallLogWrapper::glDeleteShader
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,p);
    glu::CallLogWrapper::glDeleteShader
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,GStack_48);
    local_4d = ComputeShaderBase::CheckProgram(&this->super_ComputeShaderBase,buffer,(bool *)0x0);
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&local_54);
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0,local_54);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(data.m_data + 2),0.0);
    pfVar3 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)(data.m_data + 2),0);
    glu::CallLogWrapper::glBufferData
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0x10,pfVar3,0x88e8);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0);
    glu::CallLogWrapper::glUseProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,buffer);
    glu::CallLogWrapper::glDispatchCompute
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,1,1);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_74);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,local_54);
    glu::CallLogWrapper::glMemoryBarrier
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x200);
    pfVar3 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_74,0);
    glu::CallLogWrapper::glGetBufferSubData
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0,0x10,pfVar3);
    tcu::Vector<float,_4>::Vector(&local_84,(Vector<float,_4> *)local_74);
    tcu::Vector<float,_4>::Vector(&local_94,1.0,2.0,3.0,4.0);
    bVar1 = ComputeShaderBase::IsEqual(&this->super_ComputeShaderBase,&local_84,&local_94);
    if (!bVar1) {
      anon_unknown_0::Output("Invalid value!\n");
      local_4d = 0;
    }
    glu::CallLogWrapper::glDeleteBuffers
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&local_54);
    glu::CallLogWrapper::glUseProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0);
    glu::CallLogWrapper::glDeleteProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,buffer);
    iVar2 = -1;
    if ((local_4d & 1) == 1) {
      iVar2 = 0;
    }
    this_local = (BasicBuildMonolithic *)(long)iVar2;
  }
  else {
    anon_unknown_0::Output("SHADER_TYPE should be COMPUTE_SHADER.\n");
    glu::CallLogWrapper::glDeleteShader
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,sh2);
    this_local = (BasicBuildMonolithic *)0x0;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		const char* const cs1[2] = { "#version 430 core",

									 NL "layout(local_size_x = 1) in;" NL "void Run();" NL "void main() {" NL
										"  Run();" NL "}" };

		const char* const cs2 =
			"#version 430 core" NL "layout(binding = 0, std430) buffer Output {" NL "  vec4 g_output;" NL "};" NL
			"vec4 CalculateOutput();" NL "void Run() {" NL "  g_output = CalculateOutput();" NL "}";

		const char* const cs3 =
			"#version 430 core" NL "layout(local_size_x = 1) in;" NL "layout(binding = 0, std430) buffer Output {" NL
			"  vec4 g_output;" NL "};" NL "vec4 CalculateOutput() {" NL "  g_output = vec4(0);" NL
			"  return vec4(1, 2, 3, 4);" NL "}";

		const GLuint sh1 = glCreateShader(GL_COMPUTE_SHADER);

		GLint type;
		glGetShaderiv(sh1, GL_SHADER_TYPE, &type);
		if (static_cast<GLenum>(type) != GL_COMPUTE_SHADER)
		{
			Output("SHADER_TYPE should be COMPUTE_SHADER.\n");
			glDeleteShader(sh1);
			return false;
		}

		glShaderSource(sh1, 2, cs1, NULL);
		glCompileShader(sh1);

		const GLuint sh2 = glCreateShader(GL_COMPUTE_SHADER);
		glShaderSource(sh2, 1, &cs2, NULL);
		glCompileShader(sh2);

		const GLuint sh3 = glCreateShader(GL_COMPUTE_SHADER);
		glShaderSource(sh3, 1, &cs3, NULL);
		glCompileShader(sh3);

		const GLuint p = glCreateProgram();
		glAttachShader(p, sh1);
		glAttachShader(p, sh2);
		glAttachShader(p, sh3);
		glLinkProgram(p);

		glDeleteShader(sh1);
		glDeleteShader(sh2);
		glDeleteShader(sh3);

		bool res = CheckProgram(p);

		GLuint buffer;
		glGenBuffers(1, &buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(vec4), &vec4(0.0f)[0], GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		glUseProgram(p);
		glDispatchCompute(1, 1, 1);

		vec4 data;
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, buffer);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(vec4), &data[0]);
		if (!IsEqual(data, vec4(1.0f, 2.0f, 3.0f, 4.0f)))
		{
			Output("Invalid value!\n");
			res = false;
		}

		glDeleteBuffers(1, &buffer);
		glUseProgram(0);
		glDeleteProgram(p);

		return res == true ? NO_ERROR : ERROR;
	}